

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitSIMDShift
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          SIMDShift *curr)

{
  Literal *pLVar1;
  Literal local_1f0;
  Literal local_1d8;
  Literal local_1c0;
  Literal local_1a8;
  Literal local_190;
  Literal local_178;
  Literal local_160;
  Literal local_148;
  Literal local_130;
  Literal local_118;
  Literal local_100;
  Literal local_e8;
  undefined1 local_d0 [8];
  Flow flow;
  Literal shift;
  undefined1 local_40 [8];
  Literal vec;
  
  visit((Flow *)local_d0,this,curr->vec);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_d0);
    Literal::Literal((Literal *)local_40,pLVar1);
    visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->shift);
    Flow::operator=((Flow *)local_d0,(Flow *)&flow.breakTo.super_IString.str._M_str);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar1 = Flow::getSingleValue((Flow *)local_d0);
      Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar1);
      switch(curr->op) {
      case ShlVecI8x16:
        pLVar1 = &local_1f0;
        Literal::shlI8x16(pLVar1,(Literal *)local_40,
                          (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrSVecI8x16:
        pLVar1 = &local_1d8;
        Literal::shrSI8x16(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrUVecI8x16:
        pLVar1 = &local_1c0;
        Literal::shrUI8x16(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShlVecI16x8:
        pLVar1 = &local_1a8;
        Literal::shlI16x8(pLVar1,(Literal *)local_40,
                          (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrSVecI16x8:
        pLVar1 = &local_190;
        Literal::shrSI16x8(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrUVecI16x8:
        pLVar1 = &local_178;
        Literal::shrUI16x8(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShlVecI32x4:
        pLVar1 = &local_160;
        Literal::shlI32x4(pLVar1,(Literal *)local_40,
                          (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrSVecI32x4:
        pLVar1 = &local_148;
        Literal::shrSI32x4(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrUVecI32x4:
        pLVar1 = &local_130;
        Literal::shrUI32x4(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShlVecI64x2:
        pLVar1 = &local_118;
        Literal::shlI64x2(pLVar1,(Literal *)local_40,
                          (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrSVecI64x2:
        pLVar1 = &local_100;
        Literal::shrSI64x2(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ShrUVecI64x2:
        pLVar1 = &local_e8;
        Literal::shrUI64x2(pLVar1,(Literal *)local_40,
                           (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      default:
        handle_unreachable("invalid op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0x493);
      }
      Literal::~Literal(pLVar1);
      Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_d0);
    }
    Literal::~Literal((Literal *)local_40);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_d0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDShift(SIMDShift* curr) {
    NOTE_ENTER("SIMDShift");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->shift);
    if (flow.breaking()) {
      return flow;
    }
    Literal shift = flow.getSingleValue();
    switch (curr->op) {
      case ShlVecI8x16:
        return vec.shlI8x16(shift);
      case ShrSVecI8x16:
        return vec.shrSI8x16(shift);
      case ShrUVecI8x16:
        return vec.shrUI8x16(shift);
      case ShlVecI16x8:
        return vec.shlI16x8(shift);
      case ShrSVecI16x8:
        return vec.shrSI16x8(shift);
      case ShrUVecI16x8:
        return vec.shrUI16x8(shift);
      case ShlVecI32x4:
        return vec.shlI32x4(shift);
      case ShrSVecI32x4:
        return vec.shrSI32x4(shift);
      case ShrUVecI32x4:
        return vec.shrUI32x4(shift);
      case ShlVecI64x2:
        return vec.shlI64x2(shift);
      case ShrSVecI64x2:
        return vec.shrSI64x2(shift);
      case ShrUVecI64x2:
        return vec.shrUI64x2(shift);
    }
    WASM_UNREACHABLE("invalid op");
  }